

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O1

void __thiscall dd::ProcessThreadImpl::WakeUp(ProcessThreadImpl *this,Module *module)

{
  _List_node_base *p_Var1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  for (p_Var1 = (this->_modules).
                super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->_modules; p_Var1 = p_Var1->_M_next) {
    if (p_Var1[1]._M_next == (_List_node_base *)module) {
      p_Var1[1]._M_prev = (_List_node_base *)0xffffffffffffffff;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  Event::Set(&this->_wake_up);
  return;
}

Assistant:

void ProcessThreadImpl::WakeUp(Module* module) {
		{
			AutoLock l(_lock);
			for (ModuleCallback& m : _modules){
				if (m.module == module)
					m.next_callback = kCallProcessImmediately;
			}
		}
		_wake_up.Set();
	}